

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

uint __thiscall ON_PointCloud::SizeOf(ON_PointCloud *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint local_24;
  size_t sz;
  ON_PointCloud *this_local;
  
  uVar1 = ON_Object::SizeOf((ON_Object *)this);
  uVar2 = ON_SimpleArray<ON_3dPoint>::SizeOfArray(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
  uVar3 = ON_SimpleArray<ON_3dVector>::SizeOfArray(&this->m_N);
  uVar4 = ON_SimpleArray<ON_Color>::SizeOfArray(&this->m_C);
  uVar5 = ON_SimpleArray<double>::SizeOfArray(&this->m_V);
  uVar6 = ON_SimpleArray<bool>::SizeOfArray(&this->m_H);
  uVar7 = (ulong)uVar6 +
          (ulong)uVar5 + (ulong)uVar4 + (ulong)uVar3 + (ulong)uVar2 + (ulong)uVar1 + 0x138;
  if (uVar7 < 0xffff0001) {
    local_24 = (uint)uVar7;
  }
  else {
    local_24 = 0xffff0000;
  }
  return local_24;
}

Assistant:

unsigned int ON_PointCloud::SizeOf() const
{
  // Dale Lear fixed this function in April 2021.
  // Before that all point clouds were reported to have 
  // ON_Geometry::SizeOf() bytes.

  size_t sz = ON_Geometry::SizeOf();

  sz += (sizeof(*this) - sizeof(ON_Geometry));
  sz += (size_t)(m_P.SizeOfArray());
  sz += (size_t)(m_N.SizeOfArray());
  sz += (size_t)(m_C.SizeOfArray());
  sz += (size_t)(m_V.SizeOfArray());
  sz += (size_t)(m_H.SizeOfArray());

  // Avoid overflowing 4 byte unsigned int
  // and hope the consumer of this information is 
  // converting back to size_t before doing arithmetic.
  // The low 4 bytes are zeroed so small additions won't
  // overflow unsigned int.
  return (sz > 0xFFFF0000U) ? 0xFFFF0000U : ((unsigned int)sz);
}